

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conversion.h
# Opt level: O3

BigInt * __thiscall
Conversion::convert_to_num_base
          (BigInt *__return_storage_ptr__,Conversion *this,string *num_vocab_base)

{
  mapped_type *pmVar1;
  size_type sVar2;
  char ch;
  char local_a9;
  pointer local_a8;
  size_type local_a0;
  size_type local_98;
  BigInt local_90;
  BigInt local_70;
  BigInt local_50;
  
  (__return_storage_ptr__->vector_value).super__Vector_base<long_long,_std::allocator<long_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->vector_value).super__Vector_base<long_long,_std::allocator<long_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->vector_value).super__Vector_base<long_long,_std::allocator<long_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->sign = 1;
  local_98 = num_vocab_base->_M_string_length;
  if (local_98 != 0) {
    local_a0 = (this->indexToChar)._M_string_length;
    local_a8 = (num_vocab_base->_M_dataplus)._M_p;
    sVar2 = 0;
    do {
      local_a9 = local_a8[sVar2];
      BigInt::operator*(&local_50,__return_storage_ptr__,local_a0);
      pmVar1 = std::
               map<char,_long_long,_std::less<char>,_std::allocator<std::pair<const_char,_long_long>_>_>
               ::operator[](&this->charToIndex,&local_a9);
      BigInt::BigInt(&local_70,*pmVar1);
      BigInt::operator+(&local_90,&local_50,&local_70);
      __return_storage_ptr__->sign = local_90.sign;
      std::vector<long_long,_std::allocator<long_long>_>::operator=
                (&__return_storage_ptr__->vector_value,&local_90.vector_value);
      if (local_90.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_90.vector_value.
                        super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_70.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_70.vector_value.
                        super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_50.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_50.vector_value.
                        super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      sVar2 = sVar2 + 1;
    } while (local_98 != sVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

BigInt Conversion::convert_to_num_base(string num_vocab_base) {
    BigInt conv;
    long long base = indexToChar.size();

    //! to decimal space
    for (char ch : num_vocab_base)  //! start from most significant digit
        conv = conv * base + BigInt(charToIndex[ch]);

    return conv;
}